

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap.c
# Opt level: O3

int uninit(AP_CTX *ctx)

{
  int in_EAX;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  
  if (ctx->default_dir != (char *)0x0) {
    free(ctx->default_dir);
    in_EAX = extraout_EAX;
  }
  if (ctx->config_path != (char *)0x0) {
    free(ctx->config_path);
    in_EAX = extraout_EAX_00;
  }
  if ((FILE *)ctx->config_file != (FILE *)0x0) {
    in_EAX = fclose((FILE *)ctx->config_file);
  }
  if (ctx->log_path != (char *)0x0) {
    free(ctx->log_path);
    in_EAX = extraout_EAX_01;
  }
  if ((FILE *)ctx->log_file != (FILE *)0x0) {
    in_EAX = fclose((FILE *)ctx->log_file);
  }
  if (ctx->client_ip != (char *)0x0) {
    free(ctx->client_ip);
    in_EAX = extraout_EAX_02;
  }
  if (ctx->client_command != (char *)0x0) {
    free(ctx->client_command);
    in_EAX = extraout_EAX_03;
  }
  ctx->client_ip = (char *)0x0;
  ctx->client_command = (char *)0x0;
  ctx->log_file = (FILE *)0x0;
  *(undefined8 *)&ctx->simulate = 0;
  ctx->config_file = (FILE *)0x0;
  ctx->log_path = (char *)0x0;
  ctx->default_dir = (char *)0x0;
  ctx->config_path = (char *)0x0;
  return in_EAX;
}

Assistant:

static int uninit (AP_CTX *ctx)
{
	if (ctx->default_dir != NULL)
	{
		free (ctx->default_dir);
	}

	if (ctx->config_path != NULL)
	{
		free (ctx->config_path);
	}

	if (ctx->config_file != NULL)
	{
		fclose (ctx->config_file);
	}

	if (ctx->log_path != NULL)
	{
		free (ctx->log_path);
	}

	if (ctx->log_file != NULL)
	{
		fclose (ctx->log_file);
	}

	if (ctx->client_ip != NULL)
	{
		free (ctx->client_ip);
	}

	if (ctx->client_command != NULL)
	{
		free (ctx->client_command);
	}

	memset (ctx, 0, sizeof (AP_CTX));

	return AP_NO_ERROR;
}